

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeywordExtractor.hpp
# Opt level: O0

void __thiscall cppjieba::KeywordExtractor::LoadIdfDict(KeywordExtractor *this,string *idfPath)

{
  byte bVar1;
  bool bVar2;
  undefined8 uVar3;
  ostream *poVar4;
  istream *piVar5;
  ulong uVar6;
  size_type sVar7;
  char *__nptr;
  mapped_type *pmVar8;
  string *in_RSI;
  long in_RDI;
  double dVar9;
  undefined1 auVar10 [16];
  size_t lineno;
  double idfSum;
  double idf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  buf;
  string line;
  ifstream ifs;
  key_type *in_stack_fffffffffffff838;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
  *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff850;
  Logger *in_stack_fffffffffffff870;
  istream *filename;
  undefined7 in_stack_fffffffffffff8d8;
  Logger *in_stack_fffffffffffff8e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff8e8;
  string *in_stack_fffffffffffff8f0;
  allocator local_599;
  string local_598 [32];
  Logger local_578;
  ulong local_3f8;
  double local_3f0;
  double local_3e8;
  undefined1 local_3e0 [56];
  Logger local_3a8;
  istream local_218 [520];
  string *local_10;
  
  local_10 = in_RSI;
  uVar3 = std::__cxx11::string::c_str();
  filename = local_218;
  std::ifstream::ifstream(filename,uVar3,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    limonp::Logger::Logger
              (in_stack_fffffffffffff8e0,CONCAT17(bVar1,in_stack_fffffffffffff8d8),(char *)filename,
               (int)((ulong)in_RDI >> 0x20));
    poVar4 = limonp::Logger::Stream(&local_3a8);
    poVar4 = std::operator<<(poVar4,"exp: [ifs.is_open()");
    poVar4 = std::operator<<(poVar4,"] false. ");
    poVar4 = std::operator<<(poVar4,"open ");
    poVar4 = std::operator<<(poVar4,local_10);
    std::operator<<(poVar4," failed");
    limonp::Logger::~Logger(in_stack_fffffffffffff870);
  }
  std::__cxx11::string::string((string *)(local_3e0 + 0x18));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x16aecb);
  local_3e8 = 0.0;
  local_3f0 = 0.0;
  local_3f8 = 0;
  while( true ) {
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (local_218,(string *)(local_3e0 + 0x18));
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar5 + *(long *)(*(long *)piVar5 + -0x18)));
    if (!bVar2) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x16af3f);
    uVar6 = std::__cxx11::string::empty();
    if ((uVar6 & 1) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_598," ",&local_599);
      limonp::Split(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8,
                    (string *)in_stack_fffffffffffff8e0,CONCAT17(bVar1,in_stack_fffffffffffff8d8));
      std::__cxx11::string::~string(local_598);
      std::allocator<char>::~allocator((allocator<char> *)&local_599);
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_3e0);
      if (sVar7 == 2) {
        this_00 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                   *)local_3e0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this_00,1);
        __nptr = (char *)std::__cxx11::string::c_str();
        dVar9 = atof(__nptr);
        in_stack_fffffffffffff850 =
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(in_RDI + 0xe8);
        local_3e8 = dVar9;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)this_00,0);
        pmVar8 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                 ::operator[](this_00,in_stack_fffffffffffff838);
        *pmVar8 = dVar9;
        local_3f0 = local_3e8 + local_3f0;
      }
      else {
        limonp::Logger::Logger
                  (in_stack_fffffffffffff8e0,CONCAT17(bVar1,in_stack_fffffffffffff8d8),
                   (char *)filename,(int)((ulong)in_RDI >> 0x20));
        poVar4 = limonp::Logger::Stream((Logger *)&stack0xfffffffffffff8e0);
        poVar4 = std::operator<<(poVar4,"line: ");
        in_stack_fffffffffffff870 = (Logger *)std::operator<<(poVar4,(string *)(local_3e0 + 0x18));
        poVar4 = std::operator<<((ostream *)in_stack_fffffffffffff870,", lineno: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3f8);
        std::operator<<(poVar4," empty. skipped.");
        limonp::Logger::~Logger(in_stack_fffffffffffff870);
      }
    }
    else {
      limonp::Logger::Logger
                (in_stack_fffffffffffff8e0,CONCAT17(bVar1,in_stack_fffffffffffff8d8),
                 (char *)filename,(int)((ulong)in_RDI >> 0x20));
      poVar4 = limonp::Logger::Stream(&local_578);
      poVar4 = std::operator<<(poVar4,"lineno: ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_3f8);
      std::operator<<(poVar4," empty. skipped.");
      limonp::Logger::~Logger(in_stack_fffffffffffff870);
    }
    local_3f8 = local_3f8 + 1;
  }
  if (local_3f8 != 0) {
    auVar10._8_4_ = (int)(local_3f8 >> 0x20);
    auVar10._0_8_ = local_3f8;
    auVar10._12_4_ = 0x45300000;
    *(double *)(in_RDI + 0x120) =
         local_3f0 /
         ((auVar10._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)local_3f8) - 4503599627370496.0));
    if (0.0 < *(double *)(in_RDI + 0x120)) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffff850);
      std::__cxx11::string::~string((string *)(local_3e0 + 0x18));
      std::ifstream::~ifstream(local_218);
      return;
    }
    __assert_fail("idfAverage_ > 0.0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/KeywordExtractor.hpp"
                  ,0x7a,"void cppjieba::KeywordExtractor::LoadIdfDict(const string &)");
  }
  __assert_fail("lineno",
                "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/KeywordExtractor.hpp"
                ,0x78,"void cppjieba::KeywordExtractor::LoadIdfDict(const string &)");
}

Assistant:

void LoadIdfDict(const string& idfPath) {
    ifstream ifs(idfPath.c_str());
    XCHECK(ifs.is_open()) << "open " << idfPath << " failed";
    string line ;
    vector<string> buf;
    double idf = 0.0;
    double idfSum = 0.0;
    size_t lineno = 0;
    for (; getline(ifs, line); lineno++) {
      buf.clear();
      if (line.empty()) {
        XLOG(ERROR) << "lineno: " << lineno << " empty. skipped.";
        continue;
      }
      Split(line, buf, " ");
      if (buf.size() != 2) {
        XLOG(ERROR) << "line: " << line << ", lineno: " << lineno << " empty. skipped.";
        continue;
      }
      idf = atof(buf[1].c_str());
      idfMap_[buf[0]] = idf;
      idfSum += idf;

    }

    assert(lineno);
    idfAverage_ = idfSum / lineno;
    assert(idfAverage_ > 0.0);
  }